

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiArea::~QMdiArea(QMdiArea *this)

{
  ~QMdiArea(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

QMdiArea::~QMdiArea()
{
    Q_D(QMdiArea);
    delete d->cascader;
    d->cascader = nullptr;

    delete d->regularTiler;
    d->regularTiler = nullptr;

    delete d->iconTiler;
    d->iconTiler = nullptr;

    delete d->placer;
    d->placer = nullptr;
}